

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateStFldWithCachedType
          (Lowerer *this,Instr *instrStFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  code *pcVar1;
  anon_union_2_2_18881db1_for_PropertySymOpnd_13 aVar2;
  LabelInstr *labelTypeCheckFailed;
  Func *pFVar3;
  Lowerer *pLVar4;
  bool bVar5;
  BailOutKind BVar6;
  uint uVar7;
  uint functionId;
  PropertyId PVar8;
  undefined4 *puVar9;
  SymOpnd *this_00;
  PropertySymOpnd *pPVar10;
  char16 *pcVar11;
  PropertySym *pPVar12;
  JITTimeFunctionBody *this_01;
  undefined7 extraout_var;
  LabelInstr *pLVar13;
  BranchInstr *pBVar14;
  JITTypeHolder JVar15;
  BailOutInfo *pBVar16;
  JITType *this_02;
  JITTypeHandler *this_03;
  IntConstOpnd *opndArg;
  Instr *instr;
  byte bVar17;
  JITTypeHolderBase<void> local_88;
  LabelInstr **local_80;
  LabelInstr *local_78;
  RegOpnd *local_70;
  undefined4 local_64;
  LabelInstr *local_60;
  JITTypeHolder local_58;
  Func *local_50;
  undefined4 local_44;
  Lowerer *local_40;
  PropertySymOpnd *local_38;
  
  local_40 = this;
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cdb,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
  }
  *continueAsHelperOut = false;
  if (labelHelperOut == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cde,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
  }
  *labelHelperOut = (LabelInstr *)0x0;
  if (typeOpndOut == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce1,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
  }
  *typeOpndOut = (RegOpnd *)0x0;
  bVar5 = IR::Opnd::IsSymOpnd(instrStFld->m_dst);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce4,"(instrStFld->GetDst()->IsSymOpnd())",
                       "instrStFld->GetDst()->IsSymOpnd()");
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
  }
  this_00 = IR::Opnd::AsSymOpnd(instrStFld->m_dst);
  bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar5) {
    return false;
  }
  pPVar10 = IR::Opnd::AsPropertySymOpnd(instrStFld->m_dst);
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar10);
  if (!bVar5) {
    return false;
  }
  pPVar10 = IR::Opnd::AsPropertySymOpnd(instrStFld->m_dst);
  local_38 = pPVar10;
  if ((pPVar10->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
     (bVar5 = IR::PropertySymOpnd::IsLoadedFromProto(pPVar10), bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cee,
                       "(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto())"
                       ,
                       "!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto()"
                      );
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
    pPVar10 = local_38;
  }
  bVar5 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(pPVar10);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cf0,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
    pPVar10 = local_38;
  }
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar10);
  if (!bVar5) {
    return false;
  }
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(pPVar10);
  if ((!bVar5) && (bVar5 = IR::PropertySymOpnd::NeedsLocalTypeCheck(pPVar10), !bVar5)) {
    return false;
  }
  bVar5 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(pPVar10);
  if (bVar5) {
    if ((instrStFld->field_0x38 & 0x10) != 0) {
      BVar6 = IR::Instr::GetBailOutKind(instrStFld);
      bVar5 = IR::IsTypeCheckBailOutKind(BVar6);
      if (bVar5) goto LAB_0056a573;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cfc,
                       "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())))"
                       ,
                       "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind()))"
                      );
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
    pPVar10 = local_38;
  }
LAB_0056a573:
  bVar5 = IR::PropertySymOpnd::IsTypeCheckProtected(pPVar10);
  if ((bVar5) && (pPVar10->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d00,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar5) goto LAB_0056abf7;
    *puVar9 = 0;
  }
  pLVar4 = local_40;
  local_80 = labelHelperOut;
  uVar7 = Func::GetSourceContextId(local_40->m_func);
  functionId = Func::GetLocalFunctionId(pLVar4->m_func);
  pPVar10 = local_38;
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ObjTypeSpecPhase,uVar7,functionId);
  if (bVar5) {
    pcVar11 = Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode);
    pPVar12 = Sym::AsPropertySym((pPVar10->super_SymOpnd).m_sym);
    local_50 = (Func *)CONCAT44(local_50._4_4_,pPVar12->m_propertyId);
    this_01 = Func::GetJITFunctionBody(local_40->m_func);
    JITTimeFunctionBody::GetDisplayName(this_01);
    Output::Print(L"Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar11,(ulong)local_50 & 0xffffffff);
    Output::Flush();
  }
  bVar5 = IR::PropertySymOpnd::HasFinalType(pPVar10);
  if ((bVar5) && (bVar5 = IR::PropertySymOpnd::IsLoadedFromProto(pPVar10), !bVar5)) {
    IR::PropertySymOpnd::UpdateSlotForFinalType(pPVar10);
  }
  local_50 = instrStFld->m_func;
  if ((instrStFld->field_0x38 & 0x10) == 0) {
    local_44 = 0;
  }
  else {
    BVar6 = IR::Instr::GetBailOutKind(instrStFld);
    bVar5 = IR::IsTypeCheckBailOutKind(BVar6);
    local_44 = (undefined4)CONCAT71(extraout_var,bVar5);
  }
  aVar2 = (anon_union_2_2_18881db1_for_PropertySymOpnd_13)(pPVar10->field_12).objTypeSpecFlags;
  if (((ushort)aVar2 & 0x800) == 0) {
    bVar5 = IR::PropertySymOpnd::HasFinalType(pPVar10);
    if (bVar5) {
      bVar5 = IR::PropertySymOpnd::HasInitialType(pPVar10);
      bVar17 = *(byte *)((long)&pPVar10->field_12 + 1);
      if ((bVar17 & 4) == 0 && bVar5) {
        GenerateStFldWithCachedFinalType(local_40,instrStFld,local_38);
        return true;
      }
    }
    else {
      bVar17 = (pPVar10->field_12).field_0.field_5.typeCheckSeqFlags;
    }
    if ((bVar17 & 0x20) != 0) {
      return false;
    }
    bVar5 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(local_38);
    if ((!bVar5) && (bVar5 = IR::PropertySymOpnd::NeedsLocalTypeCheck(local_38), !bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d35,
                         "(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck())"
                         ,
                         "propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck()"
                        );
      if (!bVar5) goto LAB_0056abf7;
      *puVar9 = 0;
    }
    pFVar3 = local_50;
    local_58.t = (Type)IR::LabelInstr::New(Label,local_50,true);
    local_78 = IR::LabelInstr::New(Label,pFVar3,true);
    local_60 = local_78;
    if ((char)local_44 == '\0') {
      local_78 = IR::LabelInstr::New(Label,local_50,true);
    }
    JVar15.t = (Type)local_58;
    local_70 = GenerateCachedTypeCheck
                         (local_40,instrStFld,local_38,local_78,local_60,(LabelInstr *)local_58.t);
    *typeOpndOut = local_70;
  }
  else {
    local_60 = (LabelInstr *)0x0;
    JVar15.t = (Type)0x0;
    local_78 = (LabelInstr *)0x0;
    local_70 = (RegOpnd *)0x0;
  }
  pPVar10 = local_38;
  GenerateDirectFieldStore(local_40,instrStFld,local_38);
  pFVar3 = local_50;
  if (((ushort)aVar2 & 0x800) == 0) {
    pLVar13 = IR::LabelInstr::New(Label,local_50,false);
    local_64 = 0x426;
    local_58.t = JVar15.t;
    pBVar14 = IR::BranchInstr::New(JMP,pLVar13,pFVar3);
    IR::Instr::InsertBefore(instrStFld,&pBVar14->super_Instr);
    IR::Instr::InsertBefore(instrStFld,(Instr *)local_58.t);
    bVar5 = IR::PropertySymOpnd::IsMono(pPVar10);
    labelTypeCheckFailed = local_60;
    if ((bVar5) && (bVar5 = IR::PropertySymOpnd::HasInitialType(pPVar10), pLVar4 = local_40, bVar5))
    {
      GenerateCachedTypeWithoutPropertyCheck
                (local_40,instrStFld,local_38,&local_70->super_Opnd,labelTypeCheckFailed);
      local_58 = IR::PropertySymOpnd::GetInitialType(local_38);
      JVar15 = IR::PropertySymOpnd::GetType(local_38);
      pPVar10 = local_38;
      GenerateFieldStoreWithTypeChange(pLVar4,instrStFld,local_38,local_58,JVar15);
      pBVar14 = IR::BranchInstr::New((OpCode)local_64,pLVar13,local_50);
      IR::Instr::InsertBefore(instrStFld,&pBVar14->super_Instr);
    }
    IR::Instr::InsertBefore(instrStFld,&labelTypeCheckFailed->super_Instr);
    IR::Instr::InsertAfter(instrStFld,&pLVar13->super_Instr);
    pLVar13 = local_78;
    if ((char)local_44 == '\0') {
      *continueAsHelperOut = true;
      if (local_78 == (LabelInstr *)0x0 || local_78 == labelTypeCheckFailed) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1d8d,
                           "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed)"
                           ,
                           "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed"
                          );
        if (!bVar5) goto LAB_0056abf7;
        *puVar9 = 0;
      }
      *local_80 = pLVar13;
      return false;
    }
    pBVar16 = IR::Instr::GetBailOutInfo(instrStFld);
    if (pBVar16->bailOutInstr == instrStFld) {
      pBVar16 = IR::Instr::GetBailOutInfo(instrStFld);
      if (pBVar16->polymorphicCacheIndex != pPVar10->m_inlineCacheIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1d80,
                           "(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex)"
                           ,
                           "instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex"
                          );
        if (!bVar5) goto LAB_0056abf7;
        *puVar9 = 0;
      }
    }
    else {
      uVar7 = pPVar10->m_inlineCacheIndex;
      pBVar16 = IR::Instr::GetBailOutInfo(instrStFld);
      pBVar16->polymorphicCacheIndex = uVar7;
    }
    instrStFld->m_opcode = BailOut;
    IR::Instr::FreeSrc1(instrStFld);
    IR::Instr::FreeDst(instrStFld);
    GenerateBailOut(local_40,instrStFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  else {
    local_60 = (LabelInstr *)((ulong)local_60 | (ulong)JVar15.t);
    if (local_60 != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d46,
                         "(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr)"
                         ,"labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr")
      ;
      if (!bVar5) goto LAB_0056abf7;
      *puVar9 = 0;
    }
    if (((instrStFld->field_0x38 & 0x10) != 0) &&
       (bVar5 = IR::Instr::OnlyHasLazyBailOut(instrStFld), !bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d4a,
                         "(!instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut())",
                         "Why does a direct field store have bailout that is not lazy?");
      if (!bVar5) {
LAB_0056abf7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
    bVar5 = IR::PropertySymOpnd::HasInitialType(pPVar10);
    if ((bVar5) && (bVar5 = IR::PropertySymOpnd::HasFinalType(pPVar10), bVar5)) {
      local_88.t = (Type)IR::PropertySymOpnd::GetInitialType(pPVar10);
      this_02 = JITTypeHolderBase<void>::operator->(&local_88);
      this_03 = JITType::GetTypeHandler(this_02);
      bVar5 = JITTypeHandler::IsPrototype(this_03);
      pLVar4 = local_40;
      if (bVar5) {
        LoadScriptContext(local_40,instrStFld);
        PVar8 = IR::PropertySymOpnd::GetPropertyId(pPVar10);
        opndArg = IR::IntConstOpnd::New((long)PVar8,TyInt32,pLVar4->m_func,true);
        LowererMD::LoadHelperArgument(&pLVar4->m_lowererMD,instrStFld,&opndArg->super_Opnd);
        instr = IR::Instr::New(Call,pLVar4->m_func);
        IR::Instr::InsertBefore(instrStFld,instr);
        LowererMD::ChangeToHelperCall
                  (&pLVar4->m_lowererMD,instr,HelperInvalidateProtoCaches,(LabelInstr *)0x0,
                   (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      }
    }
    IR::Instr::Remove(instrStFld);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateStFldWithCachedType(IR::Instr *instrStFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::RegOpnd *typeOpnd = nullptr;
    IR::LabelInstr* labelObjCheckFailed  = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelBothTypeChecksFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrStFld->GetDst()->IsSymOpnd());
    if (!instrStFld->GetDst()->AsSymOpnd()->IsPropertySymOpnd() || !instrStFld->GetDst()->AsPropertySymOpnd()->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrStFld->GetDst()->AsPropertySymOpnd();

    // If we have any object type spec info, we better not believe this is a load from prototype, since this is a store
    // and we never share inline caches between loads and stores.
    Assert(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto());

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    Func* func = instrStFld->m_func;

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind());

    // If the type hasn't been checked upstream, see if it makes sense to check it here.
    bool isTypeChecked = propertySymOpnd->IsTypeChecked();
    if (!isTypeChecked)
    {
        // If the initial type has been checked, we can do a hard coded type transition without any type checks
        // (see GenerateStFldWithCachedFinalType), which is always worth doing, even if the type is not needed
        // downstream.  We're not introducing any additional bailouts.
        if (propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType() && !propertySymOpnd->IsTypeDead())
        {
            // We have a final type in hand, so we can JIT (most of) the type transition work.
            return this->GenerateStFldWithCachedFinalType(instrStFld, propertySymOpnd);
        }

        if (propertySymOpnd->HasTypeMismatch())
        {
            // So we have a type mismatch, which happens when the type (and the type without property if ObjTypeSpecStore
            // is on) on this instruction didn't match the live type value according to the flow. We must have hit some
            // stale inline cache (perhaps inlined from a different function, or on a code path not taken for a while).
            // Either way, we know exactly what type the object must have at this point (fully determined by flow), but
            // we don't know whether that type already has the property we're storing here. All in all, we know exactly
            // what shape the object will have after this operation, but we're not sure what label (type) to give this
            // shape. Thus we can simply let the fast path do its thing based on the live inline cache. The downstream
            // instructions relying only on this shape (loads and stores) are safe, and those that need the next type
            // (i.e. adds) will do the same thing as this instruction.
            return false;
        }

        // If we're still here then we must need a primary type check on this instruction to protect
        // a sequence of field operations downstream, or a local type check for an isolated field store.
        Assert(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck());

        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelBothTypeChecksFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelBothTypeChecksFailed : IR::LabelInstr::New(Js::OpCode::Label, func, true);
        typeOpnd = this->GenerateCachedTypeCheck(instrStFld, propertySymOpnd, labelObjCheckFailed, labelBothTypeChecksFailed, labelTypeCheckFailed);
        *typeOpndOut = typeOpnd;
    }

    // Either we are protected by a type check upstream or we just emitted a type check above,
    // now it's time to store the field value.
    GenerateDirectFieldStore(instrStFld, propertySymOpnd);

    // If we are protected by a type check upstream, we don't need a bailout or helper here, delete the instruction
    // and return "true" to indicate that we succeeded in eliminating it.
    if (isTypeChecked)
    {
        Assert(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr);
        AssertMsg(
            !instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut(),
            "Why does a direct field store have bailout that is not lazy?"
        );

        if (propertySymOpnd->HasInitialType() && propertySymOpnd->HasFinalType())
        {
            bool isPrototypeTypeHandler = propertySymOpnd->GetInitialType()->GetTypeHandler()->IsPrototype();
            if (isPrototypeTypeHandler)
            {
                LoadScriptContext(instrStFld);
                m_lowererMD.LoadHelperArgument(instrStFld, IR::IntConstOpnd::New(propertySymOpnd->GetPropertyId(), TyInt32, m_func, true));
                IR::Instr * invalidateCallInstr = IR::Instr::New(Js::OpCode::Call, m_func);
                instrStFld->InsertBefore(invalidateCallInstr);
                m_lowererMD.ChangeToHelperCall(invalidateCallInstr, IR::HelperInvalidateProtoCaches);
            }
        }
        instrStFld->Remove();
        return true;
    }

    // Otherwise, branch around the helper on successful type check.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
    instrStFld->InsertBefore(instr);

    // On failed type check, try the type without property if we've got one.
    instrStFld->InsertBefore(labelTypeCheckFailed);

    // Caution, this is one of the dusty corners of the JIT.  We only get here if this is an isolated StFld which adds a property, or
    // ObjTypeSpecStore is off.  In the former case no downstream operations depend on the final type produced here, and we can fall
    // back on live cache and helper if the type doesn't match.  In the latter we may have a cache with type transition, which must
    // produce a value for the type after transition, because that type is consumed downstream. Thus, if the object's type doesn't
    // match either the type with or the type without the property we're storing, we must bail out here.
    bool emitAddProperty = propertySymOpnd->IsMono() && propertySymOpnd->HasInitialType();

    if (emitAddProperty)
    {
        GenerateCachedTypeWithoutPropertyCheck(instrStFld, propertySymOpnd, typeOpnd, labelBothTypeChecksFailed);
        GenerateFieldStoreWithTypeChange(instrStFld, propertySymOpnd, propertySymOpnd->GetInitialType(), propertySymOpnd->GetType());
        instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
        instrStFld->InsertBefore(instr);
    }

    instrStFld->InsertBefore(labelBothTypeChecksFailed);
    instrStFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        if (instrStFld->GetBailOutInfo()->bailOutInstr != instrStFld)
        {
            // Set the cache index in the bailout info so that the generated code will write it into the
            // bailout record at runtime.
            instrStFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        else
        {
            Assert(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex);
        }

        instrStFld->m_opcode = Js::OpCode::BailOut;
        instrStFld->FreeSrc1();
        instrStFld->FreeDst();

        this->GenerateBailOut(instrStFld);
        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}